

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MethodOptions * __thiscall
google::protobuf::MethodDescriptorProto::mutable_options(MethodDescriptorProto *this)

{
  MethodOptions *this_00;
  MethodDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (MethodOptions *)0x0) {
    this_00 = (MethodOptions *)operator_new(0x70);
    MethodOptions::MethodOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::MethodOptions* MethodDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) {
    options_ = new ::google::protobuf::MethodOptions;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.MethodDescriptorProto.options)
  return options_;
}